

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O0

void test_2d_dynamic<5ul,1ul,30ul,1ul>(void)

{
  value_type vVar1;
  value_type vVar2;
  int *piVar3;
  ulong uVar4;
  value_type vVar5;
  value_type vVar6;
  size_type sVar7;
  reference pvVar8;
  long lVar9;
  bool bVar10;
  int local_1e8 [4];
  dynamic_dims_array local_1d8;
  dynamic_dims_array local_1c8;
  size_type local_1b8;
  unsigned_long local_1b0;
  value_type true_idx_1;
  int i_1;
  int j_1;
  int *local_198;
  int *local_190;
  size_type local_188;
  unsigned_long local_180;
  value_type true_idx;
  dimensions<18446744073709551615UL,_18446744073709551615UL> s;
  int i;
  int j;
  int *dptr;
  allocator<int> local_145;
  value_type_conflict1 local_144;
  undefined1 local_140 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_120;
  unsigned_long local_118;
  size_type local_110;
  unsigned_long local_108;
  size_type local_100;
  unsigned_long local_f8;
  size_type local_f0;
  bool local_e3;
  bool local_e2;
  dimensions<0UL,_0UL> local_e1;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_e0;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_d0;
  undefined1 local_c0 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
  sub_l;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  int local_74;
  size_type local_70;
  int local_64;
  size_type local_60;
  bool local_53;
  bool local_52;
  dimensions<0UL,_0UL> local_51;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_50;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_40;
  undefined1 local_30 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
  l;
  
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_40,0x1e,1);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<int,_int,_nullptr>(&local_50,1,1);
  std::experimental::dimensions<0UL,_0UL>::dimensions(&local_51);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
              *)local_30,local_40.dynamic_dims_._M_elems[0],local_40.dynamic_dims_._M_elems[1],
             local_50.dynamic_dims_._M_elems[0],local_50.dynamic_dims_._M_elems[1]);
  local_52 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::is_regular();
  local_53 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x10d,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_52,
             &local_53);
  local_60 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                       *)local_30,0);
  local_64 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x10f,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_60,
             &local_64);
  local_70 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                       *)local_30,1);
  local_74 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x110,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_70,
             &local_74);
  local_80 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30);
  local_88 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x112,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_80,
             &local_88);
  local_90 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                     *)local_30);
  sub_l._32_8_ = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x113,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_90,
             (unsigned_long *)&sub_l.field_0x20);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_d0,6,1);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_e0,5,1);
  std::experimental::dimensions<0UL,_0UL>::dimensions(&local_e1);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
              *)local_c0,local_d0.dynamic_dims_._M_elems[0],local_d0.dynamic_dims_._M_elems[1],
             local_e0.dynamic_dims_._M_elems[0],local_e0.dynamic_dims_._M_elems[1]);
  local_e2 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::is_regular();
  local_e3 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x119,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_e2,
             &local_e3);
  local_f0 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                       *)local_c0,0);
  local_f8 = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11b,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_f0,
             &local_f8);
  local_100 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
              ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                        *)local_c0,1);
  local_108 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11c,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_100,
             &local_108);
  local_110 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                        ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_c0);
  local_118 = 6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11e,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_110,
             &local_118);
  local_120 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
              ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                      *)local_c0);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x11f,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_120,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,0);
  vVar2 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,1);
  local_144 = 0x2a;
  std::allocator<int>::allocator(&local_145);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,vVar1 * vVar2,&local_144,&local_145);
  std::allocator<int>::~allocator(&local_145);
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_140);
  s.dynamic_dims_._M_elems[1]._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)s.dynamic_dims_._M_elems[1]._4_4_;
    vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_c0,1
                           );
    if (vVar1 <= uVar4) break;
    s.dynamic_dims_._M_elems[1]._0_4_ = 0;
    while( true ) {
      uVar4 = (ulong)(int)s.dynamic_dims_._M_elems[1];
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_c0
                              ,0);
      if (vVar1 <= uVar4) break;
      _true_idx = (_Type)std::experimental::
                         layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                         ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                                     *)local_c0);
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_c0
                              ,1);
      vVar2 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,1);
      vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,0);
      lVar9 = (long)(int)s.dynamic_dims_._M_elems[1];
      vVar6 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,1);
      local_180 = vVar1 * vVar2 * vVar5 * lVar9 + vVar6 * (long)s.dynamic_dims_._M_elems[1]._4_4_;
      local_188 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_c0,(int)s.dynamic_dims_._M_elems[1],
                                   s.dynamic_dims_._M_elems[1]._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,300,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_188,
                 &local_180);
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_c0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      local_190 = piVar3 + sVar7;
      local_198 = piVar3 + local_180;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x12e,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_190,
                 &local_198);
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_c0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      piVar3[sVar7] = 0x11;
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_c0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      j_1 = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x132,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",
                 piVar3 + sVar7,&j_1);
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_c0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_140,sVar7);
      i_1 = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x135,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",pvVar8,&i_1);
      s.dynamic_dims_._M_elems[1]._0_4_ = (int)s.dynamic_dims_._M_elems[1] + 1;
    }
    s.dynamic_dims_._M_elems[1]._4_4_ = s.dynamic_dims_._M_elems[1]._4_4_ + 1;
  }
  true_idx_1._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)true_idx_1._4_4_;
    vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30,1
                           );
    if (vVar1 <= uVar4) break;
    true_idx_1._0_4_ = 0;
    while( true ) {
      uVar4 = (ulong)(int)true_idx_1;
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,0);
      if (vVar1 <= uVar4) break;
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_30
                              ,1);
      local_1b0 = vVar1 * (long)(int)true_idx_1 + (long)true_idx_1._4_4_;
      local_1b8 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                    *)local_30,(int)true_idx_1,true_idx_1._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x13e,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",&local_1b8,
                 &local_1b0);
      uVar4 = (ulong)(int)true_idx_1;
      local_1c8._M_elems =
           (_Type)std::experimental::
                  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                  ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                              *)local_c0);
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_1c8,0);
      bVar10 = false;
      if (uVar4 % vVar1 == 0) {
        uVar4 = (ulong)true_idx_1._4_4_;
        local_1d8._M_elems =
             (_Type)std::experimental::
                    layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                    ::stepping((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>_>
                                *)local_c0);
        vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_1d8,1);
        bVar10 = uVar4 % vVar1 == 0;
      }
      if (bVar10) {
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_30,(int)true_idx_1,true_idx_1._4_4_);
        local_1e8[3] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                   ,0x145,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",
                   piVar3 + sVar7,local_1e8 + 3);
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_30,(int)true_idx_1,true_idx_1._4_4_);
        pvVar8 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_140,sVar7);
        local_1e8[2] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                   ,0x148,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",pvVar8,
                   local_1e8 + 2);
      }
      else {
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_30,(int)true_idx_1,true_idx_1._4_4_);
        local_1e8[1] = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                   ,0x14d,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",
                   piVar3 + sVar7,local_1e8 + 1);
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>>
                                  *)local_30,(int)true_idx_1,true_idx_1._4_4_);
        pvVar8 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_140,sVar7);
        local_1e8[0] = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                   ,0x150,"void test_2d_dynamic() [N = 5UL, M = 1UL, X = 30UL, Y = 1UL]",pvVar8,
                   local_1e8);
      }
      true_idx_1._0_4_ = (int)true_idx_1 + 1;
    }
    true_idx_1._4_4_ = true_idx_1._4_4_ + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_140);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0>
    > const l{{X, Y}, {1, 1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0> 
    > const sub_l{{X / N, Y / M}, {N, M}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    // Initialize all elements to 42.
    std::vector<int> data(l[0] * l[1], 42);
    int* dptr = data.data();

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
        }
    }
}